

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_reserve_failure_growStrategyNull_fn(int _i)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  int line;
  char *pcVar5;
  char *pcVar6;
  ACUtilsGrowStrategy p_Var7;
  long lVar8;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 8;
  array.growStrategy = (ACUtilsGrowStrategy)0x0;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10bddc;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  if (array.size != 1) {
    uVar2 = 0;
    do {
      array.buffer[uVar2] = '5';
      uVar2 = uVar2 + 1;
    } while (uVar2 < array.size - 1);
  }
  array.buffer[array.size - 1] = '0';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x10be2d;
  bVar1 = private_ACUtils_ADynArray_reserve(&array,0x25,false,1);
  if (bVar1 == true) {
    uStack_50 = 0x10be47;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x13e);
    if (array.size == 8) {
      uStack_50 = 0x10be67;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x13f);
      if (array.capacity == 0x25) {
        uStack_50 = 0x10be87;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x140);
        if (array.buffer == (char *)0x0) {
          local_58 = 0;
          uStack_50 = 0;
          pcStack_60 = (char *)0x10c06b;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x141,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                            "(void*) array.buffer");
        }
        uStack_50 = 0x10bea7;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x141);
        lVar8 = 0;
        do {
          if ((ACUtilsGrowStrategy)(long)array.buffer[lVar8] != (ACUtilsGrowStrategy)0x35) {
            pcStack_60 = "\'5\'";
            pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar5 = "array.buffer[i] == \'5\'";
            pcVar6 = "array.buffer[i]";
            line = 0x143;
            local_58 = 0x35;
            p_Var7 = (ACUtilsGrowStrategy)(long)array.buffer[lVar8];
            goto LAB_0010bf80;
          }
          uStack_50 = 0x10becb;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x143);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        if ((ACUtilsGrowStrategy)(long)array.buffer[7] == (ACUtilsGrowStrategy)0x30) {
          uStack_50 = 0x10bef9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x144);
          if (array.growStrategy != (ACUtilsGrowStrategy)0x0) {
            expr = "Assertion \'_ck_x == NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar5 = "(void*) array.growStrategy == NULL";
            pcVar6 = "(void*) array.growStrategy";
            line = 0x145;
            ppcVar4 = (char **)&uStack_50;
            p_Var7 = array.growStrategy;
            goto LAB_0010bf82;
          }
          uStack_50 = 0x10bf18;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x145);
          if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
            uStack_50 = 0x10bf3a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x146);
            uStack_50 = 0x10bf43;
            (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
            return;
          }
          pcStack_60 = "1";
          pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
          pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
          line = 0x146;
          p_Var7 = (ACUtilsGrowStrategy)private_ACUtilsTest_ADynArray_reallocCount;
          goto LAB_0010c0fe;
        }
        pcStack_60 = "\'0\'";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
        pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
        line = 0x144;
        local_58 = 0x30;
        p_Var7 = (ACUtilsGrowStrategy)(long)array.buffer[7];
      }
      else {
        pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMax + 5";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMax + 5";
        pcVar6 = "array.capacity";
        line = 0x140;
        local_58 = 0x25;
        p_Var7 = (ACUtilsGrowStrategy)array.capacity;
      }
    }
    else {
      pcStack_60 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.size";
      line = 0x13f;
      local_58 = 8;
      p_Var7 = (ACUtilsGrowStrategy)array.size;
    }
  }
  else {
    p_Var7 = (ACUtilsGrowStrategy)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5, false, sizeof(*(&array)->buffer))"
    ;
    line = 0x13e;
LAB_0010c0fe:
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = 1;
  }
LAB_0010bf80:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar4 = &pcStack_60;
LAB_0010bf82:
  uStack_50 = 0;
  *(ACUtilsGrowStrategy *)((long)ppcVar4 + -8) = p_Var7;
  *(undefined8 *)((long)ppcVar4 + -0x10) = 0x10bf89;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_growStrategyNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 5), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMax + 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}